

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

fy_node_pair *
fy_node_mapping_pair_insert_prepare(fy_node *fyn_map,fy_node *fyn_key,fy_node *fyn_value)

{
  fy_document *pfVar1;
  fy_node_pair *pfVar2;
  
  if (fyn_map == (fy_node *)0x0) {
    return (fy_node_pair *)0x0;
  }
  if (((((((fyn_map->field_0x34 & 3) == 2) && (pfVar1 = fyn_map->fyd, pfVar1 != (fy_document *)0x0))
        && ((fyn_key == (fy_node *)0x0 || (fyn_key->fyd == pfVar1)))) &&
       ((fyn_value == (fy_node *)0x0 || (fyn_value->fyd == pfVar1)))) &&
      ((fyn_key == (fy_node *)0x0 || ((fyn_key->field_0x34 & 8) == 0)))) &&
     (((fyn_value == (fy_node *)0x0 || ((fyn_value->field_0x34 & 8) == 0)) &&
      (pfVar2 = fy_node_mapping_lookup_pair(fyn_map,fyn_key), pfVar2 == (fy_node_pair *)0x0)))) {
    pfVar2 = (fy_node_pair *)malloc(0x30);
    if (pfVar2 == (fy_node_pair *)0x0) {
      pfVar2 = (fy_node_pair *)0x0;
    }
    else {
      pfVar2->key = (fy_node *)0x0;
      pfVar2->value = (fy_node *)0x0;
      pfVar2->fyd = pfVar1;
    }
    if (pfVar2 != (fy_node_pair *)0x0) {
      if (fyn_key != (fy_node *)0x0) {
        fyn_key->parent = (fy_node *)0x0;
      }
      if (fyn_value != (fy_node *)0x0) {
        fyn_value->parent = fyn_map;
      }
      pfVar2->key = fyn_key;
      pfVar2->value = fyn_value;
      pfVar2->parent = fyn_map;
      return pfVar2;
    }
  }
  return (fy_node_pair *)0x0;
}

Assistant:

static struct fy_node_pair *
fy_node_mapping_pair_insert_prepare(struct fy_node *fyn_map,
                                    struct fy_node *fyn_key, struct fy_node *fyn_value) {
    struct fy_document *fyd;
    struct fy_node_pair *fynp;

    if (!fyn_map || fyn_map->type != FYNT_MAPPING)
        return NULL;

    /* a document must be associated with the mapping */
    fyd = fyn_map->fyd;
    if (!fyd)
        return NULL;

    /* if not NULL, the documents of the nodes must match */
    if ((fyn_key && fyn_key->fyd != fyd) ||
        (fyn_value && fyn_value->fyd != fyd))
        return NULL;

    /* if not NULL neither the key nor the value must be attached */
    if ((fyn_key && fyn_key->attached) ||
        (fyn_value && fyn_value->attached))
        return NULL;

    if (fy_node_mapping_key_is_duplicate(fyn_map, fyn_key))
        return NULL;

    fynp = fy_node_pair_alloc(fyd);
    if (!fynp)
        return NULL;

    if (fyn_key)
        fyn_key->parent = NULL;
    if (fyn_value)
        fyn_value->parent = fyn_map;

    fynp->key = fyn_key;
    fynp->value = fyn_value;
    fynp->parent = fyn_map;

    return fynp;
}